

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_print.c
# Opt level: O0

err_t cmdPrintMem2(void *buf,size_t count)

{
  char *dest;
  ulong in_RSI;
  char *hex;
  void *in_stack_ffffffffffffffd8;
  err_t local_4;
  
  dest = (char *)blobCreate((size_t)in_stack_ffffffffffffffd8);
  if (dest == (char *)0x0) {
    local_4 = 0x6e;
  }
  else {
    if (in_RSI < 0xf) {
      hexFrom(dest,in_stack_ffffffffffffffd8,0x10671a);
      printf("%s",dest);
    }
    else {
      hexFrom(dest,in_stack_ffffffffffffffd8,0x1066ae);
      dest[0x1a] = '.';
      dest[0x19] = '.';
      dest[0x18] = '.';
      hexFrom(dest,in_stack_ffffffffffffffd8,0x1066ea);
      printf("%s (%u)",dest,in_RSI & 0xffffffff);
    }
    blobClose((blob_t)0x106737);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

err_t cmdPrintMem2(const void* buf, size_t count)
{
	char* hex;
	// pre
	ASSERT(memIsValid(buf, count));
	// выделить память
	hex = (char*)blobCreate(32);
	if (!hex)
		return ERR_OUTOFMEMORY;
	// печатать
	if (count > 14)
	{
		hexFrom(hex, buf, 12);
		hex[24] = hex[25] = hex[26] = '.';
		hexFrom(hex + 27, (const octet*)buf + count - 2, 2);
		printf("%s (%u)", hex, (unsigned)count);
	}
	else
	{
		hexFrom(hex, buf, count);
		printf("%s", hex);
	}
	// завершить
	blobClose(hex);
	return ERR_OK;
}